

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int local_78;
  int local_74;
  int stop;
  int OK;
  Sound_Driver driver;
  int opt;
  char *alsaDevice;
  int local_58;
  int afnd;
  int pfnd;
  int hfnd;
  int winmm;
  int file;
  int pulse;
  int alsa;
  char *params;
  char *file_name;
  char *port;
  char *host;
  char **ppcStack_18;
  Sound_Channels channels;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  host._4_4_ = SOUND_CHANNELS_STEREO;
  params = (char *)0x0;
  _pulse = "h:p:a:lHf:dc:D:";
  file = 0;
  winmm = 0;
  hfnd = 0;
  pfnd = 0;
  afnd = 0;
  local_58 = 0;
  alsaDevice._4_4_ = 0;
  _driver = (char *)0x0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  do {
    OK = getopt((int)argv_local,ppcStack_18,_pulse);
    if (OK == -1) {
      if ((int)argv_local < 2) {
        fprintf(_stderr,
                "Usage: aisdecoder -h hostname -p port -a pulse,alsa,file [-f /path/file.raw] [-l]\n\n-h\tDestination host or IP address\n-p\tDestination UDP port\n-a\tAudio driver [pulse,alsa,file]\n-D\tALSA input device\n\tUse \'-D list\' to see all available system devices.\n-c\tSound channels [stereo,mono,left,right] (default stereo)\n-f\tFull path to 48kHz raw audio file\n-l\tLog sound levels to console (stderr)\n-d\tLog NMEA sentences to console (stderr)\n-H\tDisplay this help\n"
               );
        argv_local._4_4_ = 1;
      }
      else if (afnd == 0) {
        fprintf(_stderr,"Host is not set\n");
        argv_local._4_4_ = 1;
      }
      else if (local_58 == 0) {
        fprintf(_stderr,"Port is not set\n");
        argv_local._4_4_ = 1;
      }
      else if (alsaDevice._4_4_ == 0) {
        fprintf(_stderr,"Audio driver is not set\n");
        argv_local._4_4_ = 1;
      }
      else if ((((file == 0) && (winmm == 0)) && (pfnd == 0)) && (hfnd == 0)) {
        fprintf(_stderr,"Invalid audio driver\n");
        argv_local._4_4_ = 1;
      }
      else {
        iVar1 = initSocket(port,file_name);
        if (iVar1 == 0) {
          argv_local._4_4_ = 1;
        }
        else {
          if (show_levels != 0) {
            on_sound_level_changed = sound_level_changed;
          }
          on_nmea_sentence_received = nmea_sentence_received;
          stop = 2;
          if (file != 0) {
            stop = 0;
          }
          if (winmm != 0) {
            stop = 1;
          }
          local_74 = 0;
          local_74 = initSoundDecoder(host._4_4_,stop,params,_driver);
          local_78 = 0;
          if (local_74 == 0) {
            fprintf(_stderr,"%s\n",errorSoundDecoder);
          }
          else {
            runSoundDecoder(&local_78);
          }
          freeSoundDecoder();
          freeaddrinfo((addrinfo *)addr);
          argv_local._4_4_ = 0;
        }
      }
      return argv_local._4_4_;
    }
    switch(OK) {
    case 0x44:
      iVar1 = strcmp(_optarg,"list");
      if (iVar1 == 0) {
        printInDevices();
        return 0;
      }
      _driver = _optarg;
      break;
    case 0x48:
    default:
      fprintf(_stderr,
              "Usage: aisdecoder -h hostname -p port -a pulse,alsa,file [-f /path/file.raw] [-l]\n\n-h\tDestination host or IP address\n-p\tDestination UDP port\n-a\tAudio driver [pulse,alsa,file]\n-D\tALSA input device\n\tUse \'-D list\' to see all available system devices.\n-c\tSound channels [stereo,mono,left,right] (default stereo)\n-f\tFull path to 48kHz raw audio file\n-l\tLog sound levels to console (stderr)\n-d\tLog NMEA sentences to console (stderr)\n-H\tDisplay this help\n"
             );
      return 0;
    case 0x61:
      iVar1 = strcmp(_optarg,"pulse");
      winmm = (int)(iVar1 == 0);
      iVar1 = strcmp(_optarg,"alsa");
      file = (int)(iVar1 == 0);
      iVar1 = strcmp(_optarg,"file");
      hfnd = (int)(iVar1 == 0);
      alsaDevice._4_4_ = 1;
      break;
    case 99:
      iVar1 = strcmp(_optarg,"mono");
      if (iVar1 == 0) {
        host._4_4_ = SOUND_CHANNELS_MONO;
      }
      else {
        iVar1 = strcmp(_optarg,"left");
        if (iVar1 == 0) {
          host._4_4_ = SOUND_CHANNELS_LEFT;
        }
        else {
          iVar1 = strcmp(_optarg,"right");
          if (iVar1 == 0) {
            host._4_4_ = SOUND_CHANNELS_RIGHT;
          }
        }
      }
      break;
    case 100:
      debug_nmea = 1;
      break;
    case 0x66:
      params = _optarg;
      break;
    case 0x68:
      port = _optarg;
      afnd = 1;
      break;
    case 0x6c:
      show_levels = 1;
      break;
    case 0x70:
      file_name = _optarg;
      local_58 = 1;
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
    Sound_Channels channels = SOUND_CHANNELS_STEREO;
    char *host, *port, *file_name=NULL;
    const char *params=CMD_PARAMS;
    int alsa=0, pulse=0, file=0, winmm=0;
    int hfnd=0, pfnd=0, afnd=0;
#ifdef WIN32
    unsigned int deviceId=WAVE_MAPPER;
#endif
#ifdef HAVE_ALSA
    char *alsaDevice=NULL;
#endif
    int opt;
    while ((opt = getopt(argc, argv, params)) != -1) {
        switch (opt) {
        case 'h':
            host = optarg;
            hfnd = 1;
            break;
        case 'p':
            port = optarg;
            pfnd = 1;
            break;
        case 'a':
        #ifdef HAVE_PULSEAUDIO
            pulse = strcmp(optarg, "pulse") == 0;
        #endif
        #ifdef HAVE_ALSA
            alsa = strcmp(optarg, "alsa") == 0;
        #endif
        #ifdef WIN32
            winmm = strcmp(optarg, "winmm") == 0;
        #endif
            file = strcmp(optarg, "file") == 0;
            afnd = 1;
            break;
        case 'c':
            if (!strcmp(optarg, "mono")) channels = SOUND_CHANNELS_MONO;
            else if (!strcmp(optarg, "left")) channels = SOUND_CHANNELS_LEFT;
            else if (!strcmp(optarg, "right")) channels = SOUND_CHANNELS_RIGHT;
            break;
        case 'l':
            show_levels = 1;
            break;
        case 'f':
            file_name = optarg;
            break;
        case 'd':
            debug_nmea = 1;
            break;
#ifdef WIN32
        case 'D':
            if (!strcmp(optarg, "list")) {
                printInDevices();
                return EXIT_SUCCESS;
            } else {
                deviceId = atoi(optarg);
            }
            break;
#endif
#ifdef HAVE_ALSA
        case 'D':
            if (!strcmp(optarg, "list")) {
                printInDevices();
                return EXIT_SUCCESS;
            } else {
                alsaDevice = optarg;
            }
            break;
#endif
        case 'H':
        default:
            fprintf(stderr, HELP_MSG);
            return EXIT_SUCCESS;
            break;
        }
    }

    if (argc < 2) {
        fprintf(stderr, HELP_MSG);
        return EXIT_FAILURE;
    }

    if (!hfnd) {
        fprintf(stderr, "Host is not set\n");
        return EXIT_FAILURE;
    }

    if (!pfnd) {
        fprintf(stderr, "Port is not set\n");
        return EXIT_FAILURE;
    }

    if (!afnd) {
        fprintf(stderr, "Audio driver is not set\n");
        return EXIT_FAILURE;
    }

    if (!alsa && !pulse && !winmm && !file) {
        fprintf(stderr, "Invalid audio driver\n");
        return EXIT_FAILURE;
    }

    if (!initSocket(host, port)) {
        return EXIT_FAILURE;
    }
    if (show_levels) on_sound_level_changed=sound_level_changed;
    on_nmea_sentence_received=nmea_sentence_received;
    Sound_Driver driver = DRIVER_FILE;
#ifdef HAVE_ALSA
    if (alsa) driver = DRIVER_ALSA;
#endif
#ifdef HAVE_PULSEAUDIO
    if (pulse) driver = DRIVER_PULSE;
#endif
    int OK=0;
#ifdef WIN32
    if (!file) driver = DRIVER_WINMM;
    OK=initSoundDecoder(channels, driver, file_name, deviceId);
#else
#ifdef HAVE_ALSA
    OK=initSoundDecoder(channels, driver, file_name, alsaDevice);
#else
    OK=initSoundDecoder(channels, driver, file_name);
#endif
#endif
    int stop=0;
    if (OK) {
        runSoundDecoder(&stop);
    } else {
        fprintf(stderr, "%s\n", errorSoundDecoder);
    }
    freeSoundDecoder();
    freeaddrinfo(addr);
#ifdef WIN32
    WSACleanup();
#endif
    return 0;
}